

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfGetNamedBufferPointerv(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  GLvoid *local_40;
  GLvoid *pointer;
  GLuint not_a_buffer_name;
  undefined4 local_24;
  GLuint local_20;
  GLubyte dummy_data [4];
  GLuint buffer;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  dummy_data[3] = '\x01';
  dummy_data[2] = '\0';
  local_20 = 0;
  local_24 = 0;
  (**(code **)(lVar6 + 0x3b8))(1,&local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xe94);
  (*this->m_pNamedBufferStorage)(local_20,4,&local_24,0x42);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xe97);
  pointer._0_4_ = 0;
  do {
    pointer._0_4_ = (GLuint)pointer + 1;
    cVar1 = (**(code **)(lVar6 + 0xc68))();
  } while (cVar1 != '\0');
  local_40 = (GLvoid *)0x0;
  (*this->m_pGetNamedBufferPointerv)((GLuint)pointer,0x88bd,&local_40);
  bVar2 = ErrorCheckAndLog(this,"glGetNamedBufferPointerv",0x502,
                           " if buffer is not the name of an existing buffer object.");
  dummy_data[3] = (dummy_data[3] & 1 & bVar2) != 0;
  if (local_20 != 0) {
    (**(code **)(lVar6 + 0x438))(1,&local_20);
    local_20 = 0;
  }
  if ((dummy_data[2] & 1) == 0) {
    return (bool)(dummy_data[3] & 1);
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfGetNamedBufferPointerv()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name in GetNamedBufferPointerv function error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			glw::GLvoid* pointer = DE_NULL;

			/* Test. */
			m_pGetNamedBufferPointerv(not_a_buffer_name, GL_BUFFER_MAP_POINTER, &pointer);

			is_ok &= ErrorCheckAndLog("glGetNamedBufferPointerv", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}